

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

void __thiscall QVersionNumber::SegmentStorage::setListData(SegmentStorage *this,QList<int> *seg)

{
  QList<int> *this_00;
  undefined8 *in_RDI;
  QList<int> *in_stack_ffffffffffffffd8;
  
  this_00 = (QList<int> *)operator_new(0x18);
  QList<int>::QList(this_00,in_stack_ffffffffffffffd8);
  *in_RDI = this_00;
  return;
}

Assistant:

void QVersionNumber::SegmentStorage::setListData(QList<int> &&seg)
{
    pointer_segments = new QList<int>(std::move(seg));
}